

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fapi.c
# Opt level: O0

void nga_cadd_patch_(SingleComplex *alpha,Integer *g_a,Integer *alo,Integer *ahi,SingleComplex *beta
                    ,Integer *g_b,Integer *blo,Integer *bhi,Integer *g_c,Integer *clo,Integer *chi)

{
  Integer ctype;
  Integer btype;
  Integer atype;
  Integer in_stack_00000118;
  char *in_stack_00000120;
  Integer *in_stack_00000178;
  Integer in_stack_00000180;
  Integer in_stack_00000cc0;
  void *in_stack_00000cc8;
  Integer *in_stack_00000cd0;
  Integer *in_stack_00000cd8;
  Integer in_stack_00000ce0;
  void *in_stack_00000ce8;
  Integer *in_stack_00000d00;
  Integer *in_stack_00000d08;
  Integer in_stack_00000d10;
  Integer *in_stack_00000d18;
  Integer *in_stack_00000d20;
  undefined8 local_58;
  undefined8 local_50;
  undefined8 local_48;
  
  pnga_inquire_type(in_stack_00000180,in_stack_00000178);
  pnga_inquire_type(in_stack_00000180,in_stack_00000178);
  pnga_inquire_type(in_stack_00000180,in_stack_00000178);
  if (((local_48 != local_50) || (local_48 != local_58)) || (local_48 != 0x3ee)) {
    pnga_error(in_stack_00000120,in_stack_00000118);
  }
  pnga_add_patch(in_stack_00000ce8,in_stack_00000ce0,in_stack_00000cd8,in_stack_00000cd0,
                 in_stack_00000cc8,in_stack_00000cc0,in_stack_00000d00,in_stack_00000d08,
                 in_stack_00000d10,in_stack_00000d18,in_stack_00000d20);
  return;
}

Assistant:

void FATR nga_cadd_patch_(SingleComplex *alpha, Integer *g_a, Integer *alo, Integer *ahi, SingleComplex *beta, Integer *g_b, Integer *blo, Integer *bhi, Integer *g_c, Integer *clo, Integer *chi)
{
    Integer atype, btype, ctype;

    pnga_inquire_type(*g_a, &atype);
    pnga_inquire_type(*g_b, &btype);
    pnga_inquire_type(*g_c, &ctype);
    if (atype != btype || atype != ctype || atype != C_SCPL)
        pnga_error(" wrong types ", 0L);
    wnga_add_patch(alpha, *g_a, alo, ahi, beta, *g_b, blo, bhi, *g_c, clo, chi);
}